

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O2

void __thiscall lzham::semaphore::release(semaphore *this,long releaseCount)

{
  int iVar1;
  long lVar2;
  
  lVar2 = releaseCount + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 < 1) {
      return;
    }
    iVar1 = sem_post((sem_t *)this);
  } while (iVar1 == 0);
  lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
             ,0x3b);
  return;
}

Assistant:

inline void release(long releaseCount = 1)
      {
         LZHAM_ASSERT(releaseCount >= 1);

         int status;
#ifdef WIN32
         if (1 == releaseCount)
            status = sem_post(&m_sem);
         else
            status = sem_post_multiple(&m_sem, releaseCount);
#else
         while (releaseCount > 0)
         {
            status = sem_post(&m_sem);
            if (status)
               break;
            releaseCount--;
         }
#endif

         if (status)
         {
            LZHAM_FAIL("semaphore: sem_post() or sem_post_multiple() failed");
         }
      }